

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# footprinttocsv.cpp
# Opt level: O2

void footprinttocsv::printrowsz(int event_id,FILE *finx,longlong size,longlong uncompressed_length)

{
  pointer puVar1;
  uint uVar2;
  size_type __new_size;
  ulong uVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> uncompressed_buf;
  uLongf dest_length;
  vector<unsigned_char,_std::allocator<unsigned_char>_> compressed_buf;
  
  compressed_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  compressed_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  compressed_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&compressed_buf,size + 1);
  uncompressed_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  uncompressed_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uncompressed_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __new_size = size * 0x14;
  if (0 < uncompressed_length) {
    __new_size = uncompressed_length;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&uncompressed_buf,__new_size);
  fread(compressed_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start,size,1,(FILE *)finx);
  dest_length = (long)uncompressed_buf.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)uncompressed_buf.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
  uVar2 = uncompress(uncompressed_buf.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,&dest_length,
                     compressed_buf.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,size);
  puVar1 = uncompressed_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (uVar2 == 0) {
    for (uVar3 = 0; uVar3 < dest_length; uVar3 = uVar3 + 0xc) {
      printf("%d, %u, %d, %.10e\n",SUB84((double)*(float *)(puVar1 + uVar3 + 8),0),event_id,
             (ulong)*(uint *)(puVar1 + uVar3),(ulong)*(uint *)(puVar1 + uVar3 + 4));
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&uncompressed_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&compressed_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return;
  }
  fprintf(_stderr,"FATAL: Got bad return code from uncompress %d\n",(ulong)uVar2);
  exit(-1);
}

Assistant:

void printrowsz(int event_id, FILE *finx, long long size,
			long long uncompressed_length)
	{
		uLongf i = 0;
		std::vector<unsigned char > compressed_buf;
		compressed_buf.resize(size + 1);

		std::vector<unsigned char > uncompressed_buf;
		if (uncompressed_length > 0) {
			uncompressed_buf.resize(uncompressed_length);
		} else {
			uncompressed_buf.resize(size * 20);
		}
		fread(&compressed_buf[0], size, 1, finx);
		uLongf dest_length = (uLongf)uncompressed_buf.size();
		int ret = uncompress(&uncompressed_buf[0], &dest_length, &compressed_buf[0], size);
		if (ret != Z_OK) {
			fprintf(stderr, "FATAL: Got bad return code from uncompress %d\n", ret);
			exit(-1);
		}

		EventRow *row = (EventRow *)&uncompressed_buf[0];
		while (i < dest_length) {
#ifdef AREAPERIL_TYPE_UNSIGNED_LONG_LONG
			printf("%d, %llu, %d, %.10e\n", event_id, row->areaperil_id, row->intensity_bin_id, row->probability);
#else
			printf("%d, %u, %d, %.10e\n", event_id, row->areaperil_id, row->intensity_bin_id, row->probability);
#endif
			row++;
			i += sizeof(EventRow);
		}
	}